

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O0

QToken * queryparse::transform_hexbyte(node *atom)

{
  char *pcVar1;
  QToken *in_RDI;
  string *c;
  char hexchar;
  undefined7 in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffdf;
  node *n;
  
  tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_
            ((default_node_content *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  n = (node *)&stack0xffffffffffffffc8;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)n);
  if (*pcVar1 == '?') {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)n);
    if (*pcVar1 == '?') {
      QToken::wildcard();
      goto LAB_001bfa59;
    }
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)n);
  hexchar = (char)((ulong)in_RDI >> 0x18);
  if (*pcVar1 == '?') {
    std::__cxx11::string::operator[]((ulong)n);
    hex2int(hexchar);
    QToken::high_wildcard(in_stack_ffffffffffffffdf);
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)n);
    if (*pcVar1 == '?') {
      std::__cxx11::string::operator[]((ulong)n);
      hex2int(hexchar);
      QToken::low_wildcard(in_stack_ffffffffffffffdf);
    }
    else {
      transform_char(n);
      QToken::single((uint8_t)((ulong)n >> 0x38));
    }
  }
LAB_001bfa59:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

QToken transform_hexbyte(const parse_tree::node &atom) {
    const std::string &c = atom.content();

    if (c[0] == '?' && c[1] == '?') {  // \x??
        return QToken::wildcard();
    }
    if (c[0] == '?') {  // \x?A
        return QToken::high_wildcard(hex2int(c[1]));
    }
    if (c[1] == '?') {  // \xA?
        return QToken::low_wildcard(hex2int(c[0]) << 4U);
    }
    return QToken::single(transform_char(atom));
}